

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeIT(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint mask;
  uint pred;
  DecodeStatus S;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_4;
  
  local_2c = MCDisassembler_Success;
  local_30 = fieldFromInstruction_4(in_ESI,4,4);
  uVar1 = fieldFromInstruction_4(in_ESI,0,4);
  if (local_30 == 0xf) {
    local_30 = 0xe;
    local_2c = MCDisassembler_SoftFail;
  }
  if (uVar1 == 0) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    MCOperand_CreateImm0(in_RDI,(ulong)local_30);
    MCOperand_CreateImm0(in_RDI,(ulong)uVar1);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeIT(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred = fieldFromInstruction_4(Insn, 4, 4);
	unsigned mask = fieldFromInstruction_4(Insn, 0, 4);

	if (pred == 0xF) {
		pred = 0xE;
		S = MCDisassembler_SoftFail;
	}

	if (mask == 0x0)
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, pred);
	MCOperand_CreateImm0(Inst, mask);
	return S;
}